

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

string * replaceHtmlSymbols(string *__return_storage_ptr__,string *str)

{
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"&amp;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"&");
  ::str::replace_all(str,local_28,local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"&quot;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\"");
  ::str::replace_all(str,local_48,local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"&apos;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"\'");
  ::str::replace_all(str,local_68,local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"&gt;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,">");
  ::str::replace_all(str,local_88,local_98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"&lt;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"<");
  ::str::replace_all(str,local_a8,local_b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"&#x200B;");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"\"");
  ::str::replace_all(str,local_c8,local_d8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string replaceHtmlSymbols(std::string str) {
    str::replace_all(str, "&amp;", "&");
    str::replace_all(str, "&quot;", "\"");
    str::replace_all(str, "&apos;", "'");
    str::replace_all(str, "&gt;", ">");
    str::replace_all(str, "&lt;", "<");
    str::replace_all(str, "&#x200B;", "\"");
    return str;
}